

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O1

nbt_node * nbt_filter_inplace(nbt_node *tree,nbt_predicate_t filter,void *aux)

{
  nbt_list *pnVar1;
  list_head *plVar2;
  list_head *plVar3;
  list_head *plVar4;
  _Bool _Var5;
  nbt_node *pnVar6;
  
  if (filter == (nbt_predicate_t)0x0) {
    __assert_fail("filter",
                  "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                  0x159,"nbt_node *nbt_filter_inplace(nbt_node *, nbt_predicate_t, void *)");
  }
  if (tree != (nbt_node *)0x0) {
    _Var5 = (*filter)(tree,aux);
    if (_Var5) {
      if (1 < tree->type - TAG_LIST) {
        return tree;
      }
      pnVar1 = (tree->payload).tag_list;
      plVar2 = (pnVar1->entry).flink;
      while (plVar4 = plVar2, plVar4 != &pnVar1->entry) {
        plVar2 = plVar4->flink;
        pnVar6 = nbt_filter_inplace((nbt_node *)plVar4[-1].flink,filter,aux);
        plVar4[-1].flink = (list_head *)pnVar6;
        if (pnVar6 == (nbt_node *)0x0) {
          plVar3 = plVar4->flink;
          plVar3->blink = plVar4->blink;
          plVar4->blink->flink = plVar3;
          plVar4->blink = (list_head *)0x0;
          plVar4->flink = (list_head *)0x0;
          free(&plVar4[-1].flink);
        }
      }
      return tree;
    }
    nbt_free(tree);
  }
  return (nbt_node *)0x0;
}

Assistant:

nbt_node* nbt_filter_inplace(nbt_node* tree, nbt_predicate_t filter, void* aux)
{
    assert(filter);

    if(tree == NULL)               return                 NULL;
    if(!filter(tree, aux))         return nbt_free(tree), NULL;
    if(tree->type != TAG_LIST &&
       tree->type != TAG_COMPOUND) return tree;

    struct list_head* pos;
    struct list_head* n;
    struct nbt_list* list = tree->type == TAG_LIST ? tree->payload.tag_list : tree->payload.tag_compound;

    list_for_each_safe(pos, n, &list->entry)
    {
        struct nbt_list* cur = list_entry(pos, struct nbt_list, entry);

        cur->data = nbt_filter_inplace(cur->data, filter, aux);

        if(cur->data == NULL)
        {
            list_del(pos);
            free(cur);
        }
    }

    return tree;
}